

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

void prvTidyResetConfigToSnapshot(TidyDocImpl *doc)

{
  Bool BVar1;
  uint local_34;
  Bool needReparseTagsDecls;
  uint changedUserTags;
  TidyOptionValue *snap;
  TidyOptionValue *value;
  TidyOptionImpl *option;
  TidyDocImpl *pTStack_10;
  uint ixVal;
  TidyDocImpl *doc_local;
  
  value = (TidyOptionValue *)option_defs;
  snap = (doc->config).value;
  _needReparseTagsDecls = (doc->config).snapshot;
  pTStack_10 = doc;
  BVar1 = NeedReparseTagDecls(snap,_needReparseTagsDecls,&local_34);
  option._4_4_ = 0;
  while( true ) {
    if (0x5f < option._4_4_) {
      if (BVar1 != no) {
        ReparseTagDecls(pTStack_10,local_34);
      }
      return;
    }
    if (option._4_4_ != *(uint *)value) break;
    CopyOptionValue(pTStack_10,(TidyOptionImpl *)value,snap + option._4_4_,
                    _needReparseTagsDecls + option._4_4_);
    value = value + 7;
    option._4_4_ = option._4_4_ + 1;
  }
  __assert_fail("ixVal == (uint) option->id",
                "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/config.c"
                ,0x22e,"void prvTidyResetConfigToSnapshot(TidyDocImpl *)");
}

Assistant:

void TY_(ResetConfigToSnapshot)( TidyDocImpl* doc )
{
    uint ixVal;
    const TidyOptionImpl* option = option_defs;
    TidyOptionValue* value = &doc->config.value[ 0 ];
    const TidyOptionValue* snap  = &doc->config.snapshot[ 0 ];
    uint changedUserTags;
    Bool needReparseTagsDecls = NeedReparseTagDecls( value, snap,
                                                     &changedUserTags );
    
    for ( ixVal=0; ixVal < N_TIDY_OPTIONS; ++option, ++ixVal )
    {
        assert( ixVal == (uint) option->id );
        CopyOptionValue( doc, option, &value[ixVal], &snap[ixVal] );
    }
    if ( needReparseTagsDecls )
        ReparseTagDecls( doc, changedUserTags );
}